

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_9ab804::HandleHasItemCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status,function<bool_(const_cmCMakePath_&)> *has_item)

{
  function<bool_(const_cmCMakePath_&)> *pfVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  cmMakefile *this;
  undefined1 local_150 [7];
  bool result;
  undefined1 local_130 [8];
  cmCMakePath path;
  string local_100;
  undefined4 local_dc;
  undefined1 local_d8 [8];
  string inputPath;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  string local_48;
  function<bool_(const_cmCMakePath_&)> *local_28;
  function<bool_(const_cmCMakePath_&)> *has_item_local;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_28 = has_item;
  has_item_local = (function<bool_(const_cmCMakePath_&)> *)status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pfVar1 = has_item_local;
  if (sVar3 == 3) {
    std::__cxx11::string::string((string *)local_d8);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar2 = getInputPath(pvVar4,(cmExecutionStatus *)has_item_local,(string *)local_d8);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,2);
      uVar5 = std::__cxx11::string::empty();
      pfVar1 = has_item_local;
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::string((string *)local_150,(string *)local_d8);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   generic_format);
        std::__cxx11::string::~string((string *)local_150);
        bVar2 = std::function<bool_(const_cmCMakePath_&)>::operator()
                          (local_28,(cmCMakePath *)local_130);
        this = cmExecutionStatus::GetMakefile((cmExecutionStatus *)has_item_local);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,2);
        cmMakefile::AddDefinitionBool(this,pvVar4,bVar2);
        args_local._7_1_ = 1;
        local_dc = 1;
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_130);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"Invalid name for output variable.",
                   (allocator<char> *)
                   ((long)&path.Path._M_cmpts._M_impl._M_t.
                           super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                           ._M_t + 7));
        cmExecutionStatus::SetError((cmExecutionStatus *)pfVar1,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&path.Path._M_cmpts._M_impl._M_t.
                           super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                           ._M_t + 7));
        args_local._7_1_ = 0;
        local_dc = 1;
      }
    }
    else {
      args_local._7_1_ = 0;
      local_dc = 1;
    }
    std::__cxx11::string::~string((string *)local_d8);
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
    cmAlphaNum::cmAlphaNum(&local_78,pvVar4);
    cmAlphaNum::cmAlphaNum(&local_a8," must be called with two arguments.");
    cmStrCat<>(&local_48,&local_78,&local_a8);
    cmExecutionStatus::SetError((cmExecutionStatus *)pfVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    args_local._7_1_ = 0;
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleHasItemCommand(
  std::vector<std::string> const& args, cmExecutionStatus& status,
  const std::function<bool(const cmCMakePath&)>& has_item)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args.front(), " must be called with two arguments."));
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  if (args[2].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  cmCMakePath path(inputPath);
  auto result = has_item(path);

  status.GetMakefile().AddDefinitionBool(args[2], result);

  return true;
}